

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O0

void rd_4dim(char **content,size_t *line_no,int *array,int *dim,int *shift)

{
  int local_48 [2];
  int post [4];
  int *shift_local;
  int *dim_local;
  int *array_local;
  size_t *line_no_local;
  char **content_local;
  
  memset(local_48,0,0x10);
  rd_4dim_slice(content,line_no,array,dim,shift,local_48);
  return;
}

Assistant:

PRIVATE void
rd_4dim(char    **content,
        size_t  *line_no,
        int     *array,
        int     dim[4],
        int     shift[4])
{
  int post[4] = {
    0, 0, 0, 0
  };

  rd_4dim_slice(content, line_no, array,
                dim,
                shift,
                post);
}